

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::BufferGLImpl::UpdateData
          (BufferGLImpl *this,GLContextState *CtxState,Uint64 Offset,Uint64 Size,void *pData)

{
  GLenum GVar1;
  PFNGLBUFFERSUBDATAPROC p_Var2;
  Uint64 this_00;
  long lVar3;
  long lVar4;
  Char *Message;
  bool local_71;
  GLBufferObj local_70 [2];
  undefined1 local_58 [8];
  string msg;
  GLenum err;
  bool ResetVAO;
  void *pData_local;
  Uint64 Size_local;
  Uint64 Offset_local;
  GLContextState *CtxState_local;
  BufferGLImpl *this_local;
  
  pData_local = (void *)Size;
  Size_local = Offset;
  Offset_local = (Uint64)CtxState;
  CtxState_local = (GLContextState *)this;
  BufferMemoryBarrier(this,MEMORY_BARRIER_BUFFER_UPDATE,CtxState);
  local_71 = true;
  if (this->m_BindTarget != 0x8892) {
    local_71 = this->m_BindTarget == 0x8893;
  }
  msg.field_2._M_local_buf[0xf] = local_71;
  GLContextState::BindBuffer
            ((GLContextState *)Offset_local,this->m_BindTarget,&this->m_GlBuffer,local_71);
  p_Var2 = __glewBufferSubData;
  GVar1 = this->m_BindTarget;
  lVar3 = StaticCast<long,unsigned_long>(&Size_local);
  lVar4 = StaticCast<long,unsigned_long>((unsigned_long *)&pData_local);
  (*p_Var2)(GVar1,lVar3,lVar4,pData);
  msg.field_2._8_4_ = glGetError();
  if (msg.field_2._8_4_ != 0) {
    LogError<false,char[25],char[17],unsigned_int>
              (false,"UpdateData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xe8,(char (*) [25])"glBufferSubData() failed",(char (*) [17])"\nGL Error Code: ",
               (uint *)(msg.field_2._M_local_buf + 8));
    FormatString<char[6]>((string *)local_58,(char (*) [6])0x4585f6);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"UpdateData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xe8);
    std::__cxx11::string::~string((string *)local_58);
  }
  this_00 = Offset_local;
  GVar1 = this->m_BindTarget;
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::Null();
  GLContextState::BindBuffer
            ((GLContextState *)this_00,GVar1,local_70,(bool)(msg.field_2._M_local_buf[0xf] & 1));
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::~GLObjWrapper
            (local_70);
  return;
}

Assistant:

void BufferGLImpl::UpdateData(GLContextState& CtxState, Uint64 Offset, Uint64 Size, const void* pData)
{
    BufferMemoryBarrier(
        MEMORY_BARRIER_BUFFER_UPDATE, // Reads or writes to buffer objects via any OpenGL API functions that allow
                                      // modifying their contents will reflect data written by shaders prior to the barrier.
                                      // Additionally, writes via these commands issued after the barrier will wait on
                                      // the completion of any shader writes to the same memory initiated prior to the barrier.
        CtxState);

    // We must unbind VAO because otherwise we will break the bindings
    const auto ResetVAO = m_BindTarget == GL_ARRAY_BUFFER || m_BindTarget == GL_ELEMENT_ARRAY_BUFFER;
    CtxState.BindBuffer(m_BindTarget, m_GlBuffer, ResetVAO);
    // All buffer bind targets (GL_ARRAY_BUFFER, GL_ELEMENT_ARRAY_BUFFER etc.) relate to the same
    // kind of objects. As a result they are all equivalent from a transfer point of view.
    glBufferSubData(m_BindTarget, StaticCast<GLintptr>(Offset), StaticCast<GLsizeiptr>(Size), pData);
    DEV_CHECK_GL_ERROR("glBufferSubData() failed");
    CtxState.BindBuffer(m_BindTarget, GLObjectWrappers::GLBufferObj::Null(), ResetVAO);
}